

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyBumpObject(TidyDocImpl *doc,Node *html)

{
  Node *pNVar1;
  bool bVar2;
  Bool BVar3;
  Node *pNStack_40;
  Bool bump;
  Node *child;
  Node *body;
  Node *head;
  Node *next;
  Node *node;
  Node *html_local;
  TidyDocImpl *doc_local;
  
  body = (Node *)0x0;
  child = (Node *)0x0;
  if (html != (Node *)0x0) {
    for (next = html->content; next != (Node *)0x0; next = next->next) {
      if (((next != (Node *)0x0) && (next->tag != (Dict *)0x0)) && (next->tag->id == TidyTag_HEAD))
      {
        body = next;
      }
      if (((next != (Node *)0x0) && (next->tag != (Dict *)0x0)) && (next->tag->id == TidyTag_BODY))
      {
        child = next;
      }
    }
    if ((body != (Node *)0x0) && (child != (Node *)0x0)) {
      pNVar1 = body->content;
      while (next = pNVar1, next != (Node *)0x0) {
        pNVar1 = next->next;
        if (((next != (Node *)0x0) && (next->tag != (Dict *)0x0)) &&
           (next->tag->id == TidyTag_OBJECT)) {
          bVar2 = false;
          for (pNStack_40 = next->content; pNStack_40 != (Node *)0x0; pNStack_40 = pNStack_40->next)
          {
            BVar3 = prvTidynodeIsText(pNStack_40);
            if (((BVar3 != no) && (BVar3 = prvTidyIsBlank(doc->lexer,next), BVar3 == no)) ||
               ((pNStack_40 == (Node *)0x0 ||
                ((pNStack_40->tag == (Dict *)0x0 || (pNStack_40->tag->id != TidyTag_PARAM)))))) {
              bVar2 = true;
              break;
            }
          }
          if (bVar2) {
            prvTidyRemoveNode(next);
            prvTidyInsertNodeAtStart(child,next);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TY_(BumpObject)( TidyDocImpl* doc, Node *html )
{
    Node *node, *next, *head = NULL, *body = NULL;

    if (!html)
        return;

    for ( node = html->content; node != NULL; node = node->next )
    {
        if ( nodeIsHEAD(node) )
            head = node;

        if ( nodeIsBODY(node) )
            body = node;
    }

    if ( head != NULL && body != NULL )
    {
        for (node = head->content; node != NULL; node = next)
        {
            next = node->next;

            if ( nodeIsOBJECT(node) )
            {
                Node *child;
                Bool bump = no;

                for (child = node->content; child != NULL; child = child->next)
                {
                    /* bump to body unless content is param */
                    if ( (TY_(nodeIsText)(child) && !TY_(IsBlank)(doc->lexer, node))
                         || !nodeIsPARAM(child) )
                    {
                            bump = yes;
                            break;
                    }
                }

                if ( bump )
                {
                    TY_(RemoveNode)( node );
                    TY_(InsertNodeAtStart)( body, node );
                }
            }
        }
    }
}